

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O0

int IDASetMaxNonlinIters(void *ida_mem,int maxcor)

{
  undefined4 in_ESI;
  long in_RDI;
  bool bVar1;
  int sensi_sim;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x1e1,"IDASetMaxNonlinIters",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    bVar1 = false;
    if (*(int *)(in_RDI + 0x9c) != 0) {
      bVar1 = *(int *)(in_RDI + 0xa4) == 1;
    }
    if (bVar1) {
      if (*(long *)(in_RDI + 0x6d8) == 0) {
        IDAProcessError((IDAMem)0x0,-0x15,0x1ef,"IDASetMaxNonlinIters",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                        ,"A memory request failed.");
        local_4 = -0x15;
      }
      else {
        local_4 = SUNNonlinSolSetMaxIters(*(undefined8 *)(in_RDI + 0x6d8),in_ESI);
      }
    }
    else if (*(long *)(in_RDI + 0x6c8) == 0) {
      IDAProcessError((IDAMem)0x0,-0x15,0x1fb,"IDASetMaxNonlinIters",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                      ,"A memory request failed.");
      local_4 = -0x15;
    }
    else {
      local_4 = SUNNonlinSolSetMaxIters(*(undefined8 *)(in_RDI + 0x6c8),in_ESI);
    }
  }
  return local_4;
}

Assistant:

int IDASetMaxNonlinIters(void* ida_mem, int maxcor)
{
  IDAMem IDA_mem;
  sunbooleantype sensi_sim;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  /* Are we computing sensitivities with the simultaneous approach? */
  sensi_sim = (IDA_mem->ida_sensi && (IDA_mem->ida_ism == IDA_SIMULTANEOUS));

  if (sensi_sim)
  {
    /* check that the NLS is non-NULL */
    if (IDA_mem->NLSsim == NULL)
    {
      IDAProcessError(NULL, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    return (SUNNonlinSolSetMaxIters(IDA_mem->NLSsim, maxcor));
  }
  else
  {
    /* check that the NLS is non-NULL */
    if (IDA_mem->NLS == NULL)
    {
      IDAProcessError(NULL, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    return (SUNNonlinSolSetMaxIters(IDA_mem->NLS, maxcor));
  }
}